

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

Value * duckdb::Vector::GetValueInternal(Value *__return_storage_ptr__,Vector *v_p,idx_t index_p)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  data_ptr_t pdVar3;
  bool bVar4;
  uint8_t width;
  uint8_t width_00;
  SelectionVector *pSVar5;
  FSSTPrimitives *this;
  vector<unsigned_char,_true> *compressed_string_len;
  long lVar6;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  const_reference this_01;
  string *__x;
  pointer v_p_00;
  idx_t iVar7;
  Vector *pVVar8;
  LogicalType *pLVar9;
  InternalException *pIVar10;
  uint uVar11;
  PhysicalType type;
  undefined8 duckdb_fsst_decoder;
  LogicalType *type_00;
  const_data_ptr_t pdVar12;
  uint64_t value;
  string *this_02;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> *this_03;
  uint8_t in_R9B;
  undefined7 in_register_00000089;
  idx_t i;
  ulong uVar13;
  idx_t i_2;
  idx_t val;
  ulong uVar14;
  uhugeint_t value_00;
  interval_t interval;
  hugeint_t value_01;
  hugeint_t value_02;
  hugeint_t value_03;
  allocator local_259;
  string_t str_compressed;
  int64_t increment;
  pointer pVStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [3];
  int64_t start;
  undefined8 uStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8 [5];
  string local_190;
  child_list_t<LogicalType> local_170;
  vector<duckdb::Value,_true> local_158;
  vector<duckdb::Value,_true> local_138;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_118;
  vector<duckdb::Value,_true> local_f8;
  LogicalType local_e0;
  LogicalType local_c8;
  string local_b0;
  string local_90;
  Value local_70;
  
  bVar4 = false;
  val = index_p;
  while (!bVar4) {
    switch(v_p->vector_type) {
    case FLAT_VECTOR:
    case FSST_VECTOR:
      goto switchD_016f5354_caseD_0;
    case CONSTANT_VECTOR:
      bVar4 = true;
      val = 0;
      break;
    case DICTIONARY_VECTOR:
      pSVar5 = DictionaryVector::SelVector(v_p);
      v_p = DictionaryVector::Child(v_p);
      bVar4 = false;
      if (pSVar5->sel_vector != (sel_t *)0x0) {
        val = (idx_t)pSVar5->sel_vector[val];
        bVar4 = false;
      }
      break;
    case SEQUENCE_VECTOR:
      SequenceVector::GetSequence(v_p,&start,&increment);
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
      Value::Numeric(__return_storage_ptr__,&v_p->type,increment * lVar6 + start);
      return __return_storage_ptr__;
    default:
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&start,"Unimplemented vector type for Vector::GetValue",
                 (allocator *)&increment);
      InternalException::InternalException(pIVar10,(string *)&start);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
switchD_016f5354_caseD_0:
  pdVar3 = v_p->data;
  pLVar9 = &v_p->type;
  bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&(v_p->validity).super_TemplatedValidityMask<unsigned_long>,val);
  if (!bVar4) {
    LogicalType::LogicalType(&local_c8,pLVar9);
    Value::Value(__return_storage_ptr__,&local_c8);
    pLVar9 = &local_c8;
LAB_016f541d:
    LogicalType::~LogicalType(pLVar9);
    return __return_storage_ptr__;
  }
  if (v_p->vector_type == FSST_VECTOR) {
    if ((v_p->type).physical_type_ != VARCHAR) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&start,"FSST Vector with non-string datatype found!",
                 (allocator *)&increment);
      InternalException::InternalException(pIVar10,(string *)&start);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    str_compressed.value._0_8_ = *(undefined8 *)(pdVar3 + val * 0x10);
    str_compressed.value.pointer.ptr = (char *)*(undefined8 *)(pdVar3 + val * 0x10 + 8);
    this = (FSSTPrimitives *)FSSTVector::GetDecoder(v_p);
    compressed_string_len = FSSTVector::GetDecompressBuffer(v_p);
    duckdb_fsst_decoder = str_compressed.value.pointer.ptr;
    if ((char *)(str_compressed.value._0_8_ & 0xffffffff) < (char *)0xd) {
      duckdb_fsst_decoder = (char *)((long)&str_compressed.value + 4);
    }
    FSSTPrimitives::DecompressValue_abi_cxx11_
              ((string *)&start,this,(void *)duckdb_fsst_decoder,
               (char *)(str_compressed.value._0_8_ & 0xffffffff),(idx_t)compressed_string_len,
               (vector<unsigned_char,_true> *)CONCAT71(in_register_00000089,in_R9B));
    LVar1 = (v_p->type).id_;
    if (LVar1 == VARCHAR) {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)start == local_1e8) {
        local_190.field_2._8_8_ = local_1e8[0]._8_8_;
      }
      else {
        local_190._M_dataplus._M_p = (pointer)start;
      }
      local_190._M_string_length = uStack_1f0;
      uStack_1f0 = (char *)0x0;
      local_1e8[0]._M_local_buf[0] = '\0';
      start = (int64_t)local_1e8;
      Value::Value(__return_storage_ptr__,&local_190);
      ::std::__cxx11::string::~string((string *)&local_190);
    }
    else {
      if (LVar1 != BLOB) {
        pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&increment,"Unsupported vector type for FSST vector",&local_259);
        InternalException::InternalException(pIVar10,(string *)&increment);
        __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::BLOB_RAW(__return_storage_ptr__,(string *)&start);
    }
    this_02 = (string *)&start;
LAB_016f5641:
    ::std::__cxx11::string::~string((string *)this_02);
    return __return_storage_ptr__;
  }
  LVar1 = pLVar9->id_;
  uVar11 = LVar1 - 10;
  if (0x2c < uVar11) {
    switch(LVar1) {
    case STRUCT:
      this_00 = StructVector::GetEntries(v_p);
      str_compressed.value._0_8_ = 0;
      str_compressed.value.pointer.ptr = (char *)0x0;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar13 = uVar13 + 1) {
        this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                  ::get<true>(this_00,uVar13);
        __x = StructType::GetChildName_abi_cxx11_(pLVar9,uVar13);
        v_p_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                           (this_01);
        GetValue((Value *)&increment,v_p_00,index_p);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        ::pair<duckdb::Value,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                    *)&start,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                   (Value *)&increment);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                    *)&str_compressed,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                    *)&start);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
                 *)&start);
        Value::~Value((Value *)&increment);
      }
      local_118.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)str_compressed.value._0_8_;
      local_118.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)str_compressed.value.pointer.ptr;
      local_118.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      str_compressed.value._0_8_ = 0;
      str_compressed.value.pointer.ptr = (char *)0x0;
      Value::STRUCT(__return_storage_ptr__,(child_list_t<Value> *)&local_118);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_118);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
                 *)&str_compressed);
      return __return_storage_ptr__;
    case LIST:
      uVar13 = *(ulong *)(pdVar3 + val * 0x10);
      uVar14 = *(long *)(pdVar3 + val * 0x10 + 8) + uVar13;
      pVVar8 = ListVector::GetEntryInternal<duckdb::Vector_const>(v_p);
      increment = 0;
      pVStack_230 = (pointer)0x0;
      local_228[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      for (; uVar13 < uVar14; uVar13 = uVar13 + 1) {
        GetValue((Value *)&start,pVVar8,uVar13);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&increment,
                   (Value *)&start);
        Value::~Value((Value *)&start);
      }
      pLVar9 = ListType::GetChildType(pLVar9);
      local_138.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)increment;
      local_138.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_230;
      local_138.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_228[0]._0_8_;
      increment = 0;
      pVStack_230 = (pointer)0x0;
      local_228[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Value::LIST(__return_storage_ptr__,pLVar9,&local_138);
      this_03 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_138;
      break;
    case MAP:
      uVar13 = *(ulong *)(pdVar3 + val * 0x10);
      uVar14 = *(long *)(pdVar3 + val * 0x10 + 8) + uVar13;
      pVVar8 = ListVector::GetEntryInternal<duckdb::Vector_const>(v_p);
      increment = 0;
      pVStack_230 = (pointer)0x0;
      local_228[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      for (; uVar13 < uVar14; uVar13 = uVar13 + 1) {
        GetValue((Value *)&start,pVVar8,uVar13);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&increment,
                   (Value *)&start);
        Value::~Value((Value *)&start);
      }
      pLVar9 = ListType::GetChildType(pLVar9);
      local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)increment;
      local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_230;
      local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_228[0]._0_8_;
      increment = 0;
      pVStack_230 = (pointer)0x0;
      local_228[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Value::MAP(__return_storage_ptr__,pLVar9,&local_f8);
      this_03 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8;
      break;
    default:
      goto switchD_016f5492_caseD_18;
    case ENUM:
      PVar2 = (v_p->type).physical_type_;
      if (PVar2 == UINT32) {
        value = (uint64_t)*(uint *)(pdVar3 + val * 4);
      }
      else if (PVar2 == UINT16) {
        value = (uint64_t)*(ushort *)(pdVar3 + val * 2);
      }
      else {
        if (PVar2 != UINT8) {
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&start,"ENUM can only have unsigned integers as physical types",
                     (allocator *)&increment);
          InternalException::InternalException(pIVar10,(string *)&start);
          __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        value = (uint64_t)pdVar3[val];
      }
      Value::ENUM(__return_storage_ptr__,value,pLVar9);
      return __return_storage_ptr__;
    case AGGREGATE_STATE:
      start = *(int64_t *)(pdVar3 + val * 0x10);
      uStack_1f0 = *(ulong *)((long)(pdVar3 + val * 0x10) + 8);
      pdVar12 = (const_data_ptr_t)uStack_1f0;
      if ((start & 0xffffffffU) < 0xd) {
        pdVar12 = (const_data_ptr_t)((long)&start + 4);
      }
      Value::AGGREGATE_STATE(__return_storage_ptr__,pLVar9,pdVar12,start & 0xffffffffU);
      return __return_storage_ptr__;
    case UNION:
      bVar4 = UnionVector::TryGetTag(v_p,index_p,(union_tag_t *)&str_compressed);
      if (bVar4) {
        pVVar8 = UnionVector::GetMember(v_p,str_compressed.value._0_8_ & 0xff);
        GetValue((Value *)&start,pVVar8,index_p);
        UnionType::CopyMemberTypes_abi_cxx11_
                  ((child_list_t<LogicalType> *)&increment,(UnionType *)pLVar9,type_00);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&local_170,
                 (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  *)&increment);
        Value::Value(&local_70,(Value *)&start);
        Value::UNION(__return_storage_ptr__,&local_170,str_compressed.value.pointer.length._0_1_,
                     &local_70);
        Value::~Value(&local_70);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&local_170);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   *)&increment);
        Value::~Value((Value *)&start);
        return __return_storage_ptr__;
      }
      LogicalType::LogicalType(&local_e0,pLVar9);
      Value::Value(__return_storage_ptr__,&local_e0);
      pLVar9 = &local_e0;
      goto LAB_016f541d;
    case ARRAY:
      iVar7 = ArrayType::GetSize(pLVar9);
      uVar14 = val * iVar7;
      pVVar8 = ArrayVector::GetEntryInternal<duckdb::Vector_const>(v_p);
      local_228[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      increment = 0;
      pVStack_230 = (pointer)0x0;
      uVar13 = iVar7 + uVar14;
      for (; uVar14 < uVar13; uVar14 = uVar14 + 1) {
        GetValue((Value *)&start,pVVar8,uVar14);
        ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                  ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&increment,
                   (Value *)&start);
        Value::~Value((Value *)&start);
      }
      pLVar9 = ArrayType::GetChildType(pLVar9);
      local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)increment;
      local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_230;
      local_158.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_228[0]._0_8_;
      increment = 0;
      pVStack_230 = (pointer)0x0;
      local_228[0]._M_allocated_capacity = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Value::ARRAY(__return_storage_ptr__,pLVar9,&local_158);
      this_03 = (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_158;
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(this_03);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&increment);
    return __return_storage_ptr__;
  }
  value_00.upper =
       (long)&switchD_016f5492::switchdataD_020082ec +
       (long)(int)(&switchD_016f5492::switchdataD_020082ec)[uVar11];
  switch((uint)LVar1) {
  case 10:
    Value::BOOLEAN(__return_storage_ptr__,(bool)pdVar3[val]);
    return __return_storage_ptr__;
  case 0xb:
    Value::TINYINT(__return_storage_ptr__,pdVar3[val]);
    return __return_storage_ptr__;
  case 0xc:
    Value::SMALLINT(__return_storage_ptr__,*(int16_t *)(pdVar3 + val * 2));
    return __return_storage_ptr__;
  case 0xd:
    Value::INTEGER(__return_storage_ptr__,*(int32_t *)(pdVar3 + val * 4));
    return __return_storage_ptr__;
  case 0xe:
    Value::BIGINT(__return_storage_ptr__,*(int64_t *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0xf:
    Value::DATE(__return_storage_ptr__,(date_t)*(int32_t *)(pdVar3 + val * 4));
    return __return_storage_ptr__;
  case 0x10:
    Value::TIME(__return_storage_ptr__,(dtime_t)*(int64_t *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0x11:
    Value::TIMESTAMPSEC(__return_storage_ptr__,
                        (timestamp_sec_t)((timestamp_t *)(pdVar3 + val * 8))->value);
    return __return_storage_ptr__;
  case 0x12:
    Value::TIMESTAMPMS(__return_storage_ptr__,
                       (timestamp_ms_t)((timestamp_t *)(pdVar3 + val * 8))->value);
    return __return_storage_ptr__;
  case 0x13:
    Value::TIMESTAMP(__return_storage_ptr__,(timestamp_t)*(int64_t *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0x14:
    Value::TIMESTAMPNS(__return_storage_ptr__,
                       (timestamp_ns_t)((timestamp_t *)(pdVar3 + val * 8))->value);
    return __return_storage_ptr__;
  case 0x15:
    width = DecimalType::GetWidth(pLVar9);
    width_00 = DecimalType::GetScale(pLVar9);
    PVar2 = (v_p->type).physical_type_;
    if (PVar2 == INT128) {
      value_03.upper._0_1_ = width;
      value_03.lower = *(undefined8 *)(pdVar3 + val * 0x10 + 8);
      value_03.upper._1_7_ = 0;
      Value::DECIMAL(__return_storage_ptr__,*(Value **)(pdVar3 + val * 0x10),value_03,width_00,
                     in_R9B);
      return __return_storage_ptr__;
    }
    if (PVar2 == INT32) {
      Value::DECIMAL(__return_storage_ptr__,*(int32_t *)(pdVar3 + val * 4),width,width_00);
      return __return_storage_ptr__;
    }
    if (PVar2 == INT64) {
      Value::DECIMAL(__return_storage_ptr__,*(int64_t *)(pdVar3 + val * 8),width,width_00);
      return __return_storage_ptr__;
    }
    if (PVar2 == INT16) {
      Value::DECIMAL(__return_storage_ptr__,*(int16_t *)(pdVar3 + val * 2),width,width_00);
      return __return_storage_ptr__;
    }
    pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&start,
               "Physical type \'%s\' has a width bigger than 38, which is not supported",
               (allocator *)&increment);
    TypeIdToString_abi_cxx11_(&local_90,(duckdb *)(ulong)(v_p->type).physical_type_,type);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar10,(string *)&start,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90);
    __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 0x16:
    Value::FLOAT(__return_storage_ptr__,*(float *)(pdVar3 + val * 4));
    return __return_storage_ptr__;
  case 0x17:
    Value::DOUBLE(__return_storage_ptr__,*(double *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0x19:
    start = *(int64_t *)(pdVar3 + val * 0x10);
    uStack_1f0 = *(size_type *)((long)(pdVar3 + val * 0x10) + 8);
    string_t::GetString_abi_cxx11_(&local_b0,(string_t *)&start);
    Value::Value(__return_storage_ptr__,&local_b0);
    this_02 = &local_b0;
    goto LAB_016f5641;
  case 0x1a:
    start = *(int64_t *)(pdVar3 + val * 0x10);
    uStack_1f0 = *(ulong *)((long)(pdVar3 + val * 0x10) + 8);
    pdVar12 = (const_data_ptr_t)uStack_1f0;
    if ((start & 0xffffffffU) < 0xd) {
      pdVar12 = (const_data_ptr_t)((long)&start + 4);
    }
    Value::BLOB(__return_storage_ptr__,pdVar12,start & 0xffffffffU);
    return __return_storage_ptr__;
  case 0x1b:
    interval.micros = value_00.upper;
    interval._0_8_ = *(undefined8 *)(pdVar3 + val * 0x10 + 8);
    Value::INTERVAL(__return_storage_ptr__,*(Value **)(pdVar3 + val * 0x10),interval);
    return __return_storage_ptr__;
  case 0x1c:
    Value::UTINYINT(__return_storage_ptr__,pdVar3[val]);
    return __return_storage_ptr__;
  case 0x1d:
    Value::USMALLINT(__return_storage_ptr__,*(uint16_t *)(pdVar3 + val * 2));
    return __return_storage_ptr__;
  case 0x1e:
    Value::UINTEGER(__return_storage_ptr__,*(uint32_t *)(pdVar3 + val * 4));
    return __return_storage_ptr__;
  case 0x1f:
    Value::UBIGINT(__return_storage_ptr__,*(uint64_t *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0x20:
    Value::TIMESTAMPTZ(__return_storage_ptr__,
                       (timestamp_tz_t)((timestamp_t *)(pdVar3 + val * 8))->value);
    return __return_storage_ptr__;
  case 0x22:
    Value::TIMETZ(__return_storage_ptr__,(dtime_tz_t)*(uint64_t *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0x24:
    start = *(int64_t *)(pdVar3 + val * 0x10);
    uStack_1f0 = *(ulong *)((long)(pdVar3 + val * 0x10) + 8);
    pdVar12 = (const_data_ptr_t)uStack_1f0;
    if ((start & 0xffffffffU) < 0xd) {
      pdVar12 = (const_data_ptr_t)((long)&start + 4);
    }
    Value::BIT(__return_storage_ptr__,pdVar12,start & 0xffffffffU);
    return __return_storage_ptr__;
  case 0x27:
    start = *(int64_t *)(pdVar3 + val * 0x10);
    uStack_1f0 = *(ulong *)((long)(pdVar3 + val * 0x10) + 8);
    pdVar12 = (const_data_ptr_t)uStack_1f0;
    if ((start & 0xffffffffU) < 0xd) {
      pdVar12 = (const_data_ptr_t)((long)&start + 4);
    }
    Value::VARINT(__return_storage_ptr__,pdVar12,start & 0xffffffffU);
    return __return_storage_ptr__;
  case 0x31:
    value_00.lower = *(uint64_t *)(pdVar3 + val * 0x10 + 8);
    Value::UHUGEINT(__return_storage_ptr__,*(Value **)(pdVar3 + val * 0x10),value_00);
    return __return_storage_ptr__;
  case 0x32:
    value_01.upper = value_00.upper;
    value_01.lower = *(uint64_t *)(pdVar3 + val * 0x10 + 8);
    Value::HUGEINT(__return_storage_ptr__,*(Value **)(pdVar3 + val * 0x10),value_01);
    return __return_storage_ptr__;
  case 0x33:
    Value::POINTER(__return_storage_ptr__,*(uintptr_t *)(pdVar3 + val * 8));
    return __return_storage_ptr__;
  case 0x36:
    value_02.upper = value_00.upper;
    value_02.lower = *(uint64_t *)(pdVar3 + val * 0x10 + 8);
    Value::UUID(__return_storage_ptr__,*(Value **)(pdVar3 + val * 0x10),value_02);
    return __return_storage_ptr__;
  }
switchD_016f5492_caseD_18:
  pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&start,"Unimplemented type for value access",(allocator *)&increment);
  InternalException::InternalException(pIVar10,(string *)&start);
  __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

Value Vector::GetValueInternal(const Vector &v_p, idx_t index_p) {
	const Vector *vector = &v_p;
	idx_t index = index_p;
	bool finished = false;
	while (!finished) {
		switch (vector->GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			index = 0;
			finished = true;
			break;
		case VectorType::FLAT_VECTOR:
			finished = true;
			break;
		case VectorType::FSST_VECTOR:
			finished = true;
			break;
		// dictionary: apply dictionary and forward to child
		case VectorType::DICTIONARY_VECTOR: {
			auto &sel_vector = DictionaryVector::SelVector(*vector);
			auto &child = DictionaryVector::Child(*vector);
			vector = &child;
			index = sel_vector.get_index(index);
			break;
		}
		case VectorType::SEQUENCE_VECTOR: {
			int64_t start, increment;
			SequenceVector::GetSequence(*vector, start, increment);
			return Value::Numeric(vector->GetType(), start + increment * NumericCast<int64_t>(index));
		}
		default:
			throw InternalException("Unimplemented vector type for Vector::GetValue");
		}
	}
	auto data = vector->data;
	auto &validity = vector->validity;
	auto &type = vector->GetType();

	if (!validity.RowIsValid(index)) {
		return Value(vector->GetType());
	}

	if (vector->GetVectorType() == VectorType::FSST_VECTOR) {
		if (vector->GetType().InternalType() != PhysicalType::VARCHAR) {
			throw InternalException("FSST Vector with non-string datatype found!");
		}
		auto str_compressed = reinterpret_cast<string_t *>(data)[index];
		auto decoder = FSSTVector::GetDecoder(*vector);
		auto &decompress_buffer = FSSTVector::GetDecompressBuffer(*vector);
		auto string_val = FSSTPrimitives::DecompressValue(decoder, str_compressed.GetData(), str_compressed.GetSize(),
		                                                  decompress_buffer);
		switch (vector->GetType().id()) {
		case LogicalTypeId::VARCHAR:
			return Value(std::move(string_val));
		case LogicalTypeId::BLOB:
			return Value::BLOB_RAW(string_val);
		default:
			throw InternalException("Unsupported vector type for FSST vector");
		}
	}

	switch (vector->GetType().id()) {
	case LogicalTypeId::BOOLEAN:
		return Value::BOOLEAN(reinterpret_cast<bool *>(data)[index]);
	case LogicalTypeId::TINYINT:
		return Value::TINYINT(reinterpret_cast<int8_t *>(data)[index]);
	case LogicalTypeId::SMALLINT:
		return Value::SMALLINT(reinterpret_cast<int16_t *>(data)[index]);
	case LogicalTypeId::INTEGER:
		return Value::INTEGER(reinterpret_cast<int32_t *>(data)[index]);
	case LogicalTypeId::DATE:
		return Value::DATE(reinterpret_cast<date_t *>(data)[index]);
	case LogicalTypeId::TIME:
		return Value::TIME(reinterpret_cast<dtime_t *>(data)[index]);
	case LogicalTypeId::TIME_TZ:
		return Value::TIMETZ(reinterpret_cast<dtime_tz_t *>(data)[index]);
	case LogicalTypeId::BIGINT:
		return Value::BIGINT(reinterpret_cast<int64_t *>(data)[index]);
	case LogicalTypeId::UTINYINT:
		return Value::UTINYINT(reinterpret_cast<uint8_t *>(data)[index]);
	case LogicalTypeId::USMALLINT:
		return Value::USMALLINT(reinterpret_cast<uint16_t *>(data)[index]);
	case LogicalTypeId::UINTEGER:
		return Value::UINTEGER(reinterpret_cast<uint32_t *>(data)[index]);
	case LogicalTypeId::UBIGINT:
		return Value::UBIGINT(reinterpret_cast<uint64_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP:
		return Value::TIMESTAMP(reinterpret_cast<timestamp_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_NS:
		return Value::TIMESTAMPNS(reinterpret_cast<timestamp_ns_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_MS:
		return Value::TIMESTAMPMS(reinterpret_cast<timestamp_ms_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Value::TIMESTAMPSEC(reinterpret_cast<timestamp_sec_t *>(data)[index]);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Value::TIMESTAMPTZ(reinterpret_cast<timestamp_tz_t *>(data)[index]);
	case LogicalTypeId::HUGEINT:
		return Value::HUGEINT(reinterpret_cast<hugeint_t *>(data)[index]);
	case LogicalTypeId::UHUGEINT:
		return Value::UHUGEINT(reinterpret_cast<uhugeint_t *>(data)[index]);
	case LogicalTypeId::UUID:
		return Value::UUID(reinterpret_cast<hugeint_t *>(data)[index]);
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (type.InternalType()) {
		case PhysicalType::INT16:
			return Value::DECIMAL(reinterpret_cast<int16_t *>(data)[index], width, scale);
		case PhysicalType::INT32:
			return Value::DECIMAL(reinterpret_cast<int32_t *>(data)[index], width, scale);
		case PhysicalType::INT64:
			return Value::DECIMAL(reinterpret_cast<int64_t *>(data)[index], width, scale);
		case PhysicalType::INT128:
			return Value::DECIMAL(reinterpret_cast<hugeint_t *>(data)[index], width, scale);
		default:
			throw InternalException("Physical type '%s' has a width bigger than 38, which is not supported",
			                        TypeIdToString(type.InternalType()));
		}
	}
	case LogicalTypeId::ENUM: {
		switch (type.InternalType()) {
		case PhysicalType::UINT8:
			return Value::ENUM(reinterpret_cast<uint8_t *>(data)[index], type);
		case PhysicalType::UINT16:
			return Value::ENUM(reinterpret_cast<uint16_t *>(data)[index], type);
		case PhysicalType::UINT32:
			return Value::ENUM(reinterpret_cast<uint32_t *>(data)[index], type);
		default:
			throw InternalException("ENUM can only have unsigned integers as physical types");
		}
	}
	case LogicalTypeId::POINTER:
		return Value::POINTER(reinterpret_cast<uintptr_t *>(data)[index]);
	case LogicalTypeId::FLOAT:
		return Value::FLOAT(reinterpret_cast<float *>(data)[index]);
	case LogicalTypeId::DOUBLE:
		return Value::DOUBLE(reinterpret_cast<double *>(data)[index]);
	case LogicalTypeId::INTERVAL:
		return Value::INTERVAL(reinterpret_cast<interval_t *>(data)[index]);
	case LogicalTypeId::VARCHAR: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value(str.GetString());
	}
	case LogicalTypeId::BLOB: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::BLOB(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::VARINT: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::VARINT(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::AGGREGATE_STATE: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::AGGREGATE_STATE(vector->GetType(), const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::BIT: {
		auto str = reinterpret_cast<string_t *>(data)[index];
		return Value::BIT(const_data_ptr_cast(str.GetData()), str.GetSize());
	}
	case LogicalTypeId::MAP: {
		auto offlen = reinterpret_cast<list_entry_t *>(data)[index];
		auto &child_vec = ListVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offlen.offset; i < offlen.offset + offlen.length; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::MAP(ListType::GetChildType(type), std::move(children));
	}
	case LogicalTypeId::UNION: {
		// Remember to pass the original index_p here so we dont slice twice when looking up the tag
		// in case this is a dictionary vector
		union_tag_t tag;
		if (UnionVector::TryGetTag(*vector, index_p, tag)) {
			auto value = UnionVector::GetMember(*vector, tag).GetValue(index_p);
			auto members = UnionType::CopyMemberTypes(type);
			return Value::UNION(members, tag, std::move(value));
		} else {
			return Value(vector->GetType());
		}
	}
	case LogicalTypeId::STRUCT: {
		// we can derive the value schema from the vector schema
		auto &child_entries = StructVector::GetEntries(*vector);
		child_list_t<Value> children;
		for (idx_t child_idx = 0; child_idx < child_entries.size(); child_idx++) {
			auto &struct_child = child_entries[child_idx];
			children.push_back(make_pair(StructType::GetChildName(type, child_idx), struct_child->GetValue(index_p)));
		}
		return Value::STRUCT(std::move(children));
	}
	case LogicalTypeId::LIST: {
		auto offlen = reinterpret_cast<list_entry_t *>(data)[index];
		auto &child_vec = ListVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offlen.offset; i < offlen.offset + offlen.length; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::LIST(ListType::GetChildType(type), std::move(children));
	}
	case LogicalTypeId::ARRAY: {
		auto stride = ArrayType::GetSize(type);
		auto offset = index * stride;
		auto &child_vec = ArrayVector::GetEntry(*vector);
		duckdb::vector<Value> children;
		for (idx_t i = offset; i < offset + stride; i++) {
			children.push_back(child_vec.GetValue(i));
		}
		return Value::ARRAY(ArrayType::GetChildType(type), std::move(children));
	}
	default:
		throw InternalException("Unimplemented type for value access");
	}
}